

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O1

ze_result_t
loader::zesFabricPortGetMultiPortThroughput
          (zes_device_handle_t hDevice,uint32_t numPorts,zes_fabric_port_handle_t *phPort,
          zes_fabric_port_throughput_t **pThroughput)

{
  code *pcVar1;
  undefined8 uVar2;
  ze_result_t zVar3;
  void *pvVar4;
  ulong uVar5;
  bool bVar6;
  
  pcVar1 = *(code **)(*(long *)(hDevice + 8) + 0xc10);
  if (pcVar1 == (code *)0x0) {
    zVar3 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    uVar2 = *(undefined8 *)hDevice;
    pvVar4 = operator_new__((ulong)numPorts * 8);
    if (numPorts != 0 && phPort != (zes_fabric_port_handle_t *)0x0) {
      uVar5 = 1;
      do {
        *(undefined8 *)((long)pvVar4 + uVar5 * 8 + -8) = *(undefined8 *)phPort[uVar5 - 1];
        if (phPort == (zes_fabric_port_handle_t *)0x0) break;
        bVar6 = uVar5 < numPorts;
        uVar5 = uVar5 + 1;
      } while (bVar6);
    }
    zVar3 = (*pcVar1)(uVar2,numPorts,pvVar4,pThroughput);
    operator_delete__(pvVar4);
  }
  return zVar3;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesFabricPortGetMultiPortThroughput(
        zes_device_handle_t hDevice,                    ///< [in] Sysman handle of the device.
        uint32_t numPorts,                              ///< [in] Number of ports enumerated in function ::zesDeviceEnumFabricPorts
        zes_fabric_port_handle_t* phPort,               ///< [in][range(0, numPorts)] array of fabric port handles provided by user
                                                        ///< to gather throughput values. 
        zes_fabric_port_throughput_t** pThroughput      ///< [out][range(0, numPorts)] array of fabric port throughput counters
                                                        ///< from multiple ports of type ::zes_fabric_port_throughput_t.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_device_object_t*>( hDevice )->dditable;
        auto pfnGetMultiPortThroughput = dditable->zes.FabricPort.pfnGetMultiPortThroughput;
        if( nullptr == pfnGetMultiPortThroughput )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hDevice = reinterpret_cast<zes_device_object_t*>( hDevice )->handle;

        // convert loader handles to driver handles
        auto phPortLocal = new zes_fabric_port_handle_t [numPorts];
        for( size_t i = 0; ( nullptr != phPort ) && ( i < numPorts ); ++i )
            phPortLocal[ i ] = reinterpret_cast<zes_fabric_port_object_t*>( phPort[ i ] )->handle;

        // forward to device-driver
        result = pfnGetMultiPortThroughput( hDevice, numPorts, phPortLocal, pThroughput );
        delete []phPortLocal;

        return result;
    }